

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManEquivFixOutputPairs(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  iVar5 = p->nRegs;
  pVVar6 = p->vCos;
  uVar8 = pVVar6->nSize;
  uVar9 = uVar8 - iVar5;
  if ((uVar9 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x339,"void Gia_ManEquivFixOutputPairs(Gia_Man_t *)");
  }
  if (0 < (int)uVar9) {
    lVar7 = 0;
    do {
      if ((int)uVar8 <= lVar7) {
LAB_001fe692:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = pVVar6->pArray[lVar7];
      if (((long)(int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
LAB_001fe673:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return;
      }
      if ((long)(int)uVar9 <= (long)(lVar7 + 1U)) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((ulong)uVar8 <= lVar7 + 1U) goto LAB_001fe692;
      uVar8 = pVVar6->pArray[lVar7 + 1];
      if (((long)(int)uVar8 < 0) || ((uint)p->nObjs <= uVar8)) goto LAB_001fe673;
      pGVar4 = pGVar2 + (int)uVar1;
      pGVar2 = pGVar2 + (int)uVar8;
      uVar3 = *(ulong *)pGVar4;
      if (((ulong)((uint)(uVar3 >> 0x1d) & 1) ^ (ulong)(pGVar4 + -(uVar3 & 0x1fffffff))) ==
          ((ulong)((uint)(*(ulong *)pGVar2 >> 0x1d) & 1) ^
          (ulong)(pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff)))) {
        *(ulong *)pGVar4 = uVar3 & 0xffffffffc0000000 | (ulong)(uVar1 & 0x1fffffff);
        pGVar4 = p->pObjs;
        if ((pGVar2 < pGVar4) || (pGVar4 + p->nObjs <= pGVar2)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        *(ulong *)pGVar2 =
             *(ulong *)pGVar2 & 0xffffffffc0000000 |
             (ulong)(((uint)((int)pGVar2 - (int)pGVar4) >> 2) * -0x55555555 & 0x1fffffff);
        iVar5 = p->nRegs;
        pVVar6 = p->vCos;
      }
      uVar8 = pVVar6->nSize;
      uVar9 = uVar8 - iVar5;
      lVar7 = lVar7 + 2;
    } while ((int)lVar7 < (int)uVar9);
  }
  return;
}

Assistant:

void Gia_ManEquivFixOutputPairs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj0, * pObj1;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    Gia_ManForEachPo( p, pObj0, i )
    {
        pObj1 = Gia_ManPo( p, ++i );
        if ( Gia_ObjChild0(pObj0) != Gia_ObjChild0(pObj1) )
            continue;
        pObj0->iDiff0  = Gia_ObjId(p, pObj0);
        pObj0->fCompl0 = 0;
        pObj1->iDiff0  = Gia_ObjId(p, pObj1);
        pObj1->fCompl0 = 0;
    }
}